

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void swap_endianness<long>(long *ptr,size_t n_els)

{
  ulong in_RSI;
  size_t ix;
  undefined8 local_18;
  
  for (local_18 = 0; local_18 < in_RSI; local_18 = local_18 + 1) {
    endian_swap((int64_t *)0x65fb06);
  }
  return;
}

Assistant:

void swap_endianness(dtype *ptr, size_t n_els) noexcept
{
    #ifndef __GNUC__
    if (std::is_same<dtype, size_t>::value)
    {
        for (size_t ix = 0; ix < n_els; ix++)
            endian_swap_size_t((char*)&ptr[ix]);
        return;
    }

    else if (std::is_same<dtype, int>::value)
    {
        for (size_t ix = 0; ix < n_els; ix++)
            endian_swap_int((char*)&ptr[ix]);
        return;
    }
    #endif

    for (size_t ix = 0; ix < n_els; ix++)
        endian_swap(ptr[ix]);
}